

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O3

void __thiscall
so_5::environment_t::single_timer<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
          (environment_t *this,type_index subscription_type,
          unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
          *msg,message_mutability_t mutability,mbox_t *mbox,duration pause)

{
  atomic_refcounted_t *paVar1;
  next_turn *pnVar2;
  _Head_base<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_false> local_38
  ;
  type_index local_30;
  
  local_30._M_target = subscription_type._M_target;
  ensure_message_with_actual_data<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
            ((msg->_M_t).
             super___uniq_ptr_impl<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
             .
             super__Head_base<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_false>
             ._M_head_impl);
  pnVar2 = (msg->_M_t).
           super___uniq_ptr_impl<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
           .
           super__Head_base<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_false>
           ._M_head_impl;
  (**(code **)((long)(pnVar2->super_message_t)._vptr_message_t + 0x20))(pnVar2,mutability);
  local_38._M_head_impl =
       (msg->_M_t).
       super___uniq_ptr_impl<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
       .
       super__Head_base<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_false>
       ._M_head_impl;
  (msg->_M_t).
  super___uniq_ptr_impl<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
  .super__Head_base<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_false>.
  _M_head_impl = (next_turn *)0x0;
  if (local_38._M_head_impl != (next_turn *)0x0) {
    LOCK();
    paVar1 = &((local_38._M_head_impl)->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long> =
         (__atomic_base<unsigned_long>)
         ((__int_type)(paVar1->m_ref_counter).super___atomic_base<unsigned_long> + 1);
    UNLOCK();
  }
  single_timer(this,&local_30,(message_ref_t *)&local_38,mbox,pause);
  if (local_38._M_head_impl != (next_turn *)0x0) {
    LOCK();
    paVar1 = &((local_38._M_head_impl)->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_38._M_head_impl != (next_turn *)0x0)) {
      (*((local_38._M_head_impl)->super_message_t)._vptr_message_t[1])();
    }
  }
  return;
}

Assistant:

void
		single_timer(
			//! Type to be used for searching subscribers.
			std::type_index subscription_type,
			//! Message to be sent after timeout.
			std::unique_ptr< MESSAGE > msg,
			//! Mutability flag for that message.
			message_mutability_t mutability,
			//! Mbox to which message will be delivered.
			const mbox_t & mbox,
			//! Timeout before delivery.
			std::chrono::steady_clock::duration pause )
		{
			ensure_message_with_actual_data( msg.get() );

			change_message_mutability( *msg, mutability );

			single_timer(
				subscription_type,
				message_ref_t( msg.release() ),
				mbox,
				pause );
		}